

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemViewPrivate::openEditor
          (QAbstractItemViewPrivate *this,QModelIndex *index,QEvent *event)

{
  bool bVar1;
  QAbstractItemView *pQVar2;
  QStyleOptionViewItem *pQVar3;
  QWidget *pQVar4;
  QEvent *in_RDX;
  StateFlag other;
  undefined8 in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QAbstractItemView *q;
  QModelIndex buddy;
  QStyleOptionViewItem options;
  undefined4 in_stack_fffffffffffffe98;
  State in_stack_fffffffffffffe9c;
  QStyleOptionViewItem *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  QAbstractItemViewPrivate *options_00;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  byte bVar5;
  QAbstractItemViewPrivate *in_stack_fffffffffffffee8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [8];
  QFlags<QStyle::StateFlag> aQStack_d0 [2];
  undefined1 local_c8 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  options_00 = in_RDI;
  pQVar2 = q_func(in_RDI);
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)in_RDI->model + 0x148))(&local_f0,in_RDI->model,in_RSI);
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x80a10f);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x2f8))
            (pQVar2,local_d8);
  local_c8 = (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                         0x1e0))(pQVar2,&local_f0);
  QAbstractItemView::currentIndex
            ((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  bVar1 = ::operator==((QModelIndex *)in_stack_fffffffffffffea0,
                       (QModelIndex *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
  ;
  other = State_None;
  if (bVar1) {
    other = State_HasFocus;
  }
  QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,other);
  pQVar3 = (QStyleOptionViewItem *)
           editor(in_stack_fffffffffffffee8,
                  (QModelIndex *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                  (QStyleOptionViewItem *)options_00);
  if (pQVar3 == (QStyleOptionViewItem *)0x0) {
    bVar5 = 0;
  }
  else {
    QAbstractItemView::setState
              ((QAbstractItemView *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    QWidget::show((QWidget *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    if ((in_RDI->waitForIMCommit & 1U) == 0) {
      QWidget::setFocus((QWidget *)0x80a201);
    }
    else {
      QWidget::updateMicroFocus
                ((QWidget *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (InputMethodQuery)((ulong)in_RDI >> 0x20));
    }
    if (in_RDX != (QEvent *)0x0) {
      pQVar4 = QWidget::focusProxy((QWidget *)in_stack_fffffffffffffea0);
      if (pQVar4 != (QWidget *)0x0) {
        pQVar3 = (QStyleOptionViewItem *)QWidget::focusProxy((QWidget *)in_stack_fffffffffffffea0);
      }
      in_stack_fffffffffffffea0 = pQVar3;
      QCoreApplication::sendEvent((QObject *)in_stack_fffffffffffffea0,in_RDX);
    }
    bVar5 = 1;
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffffea0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool QAbstractItemViewPrivate::openEditor(const QModelIndex &index, QEvent *event)
{
    Q_Q(QAbstractItemView);

    QModelIndex buddy = model->buddy(index);
    QStyleOptionViewItem options;
    q->initViewItemOption(&options);
    options.rect = q->visualRect(buddy);
    options.state |= (buddy == q->currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);

    QWidget *w = editor(buddy, options);
    if (!w)
        return false;

    q->setState(QAbstractItemView::EditingState);
    w->show();
    if (!waitForIMCommit)
        w->setFocus();
    else
        q->updateMicroFocus();

    if (event)
        QCoreApplication::sendEvent(w->focusProxy() ? w->focusProxy() : w, event);

    return true;
}